

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

void helicsBrokerSetGlobal(HelicsBroker broker,char *valueName,char *value,HelicsError *err)

{
  Broker *pBVar1;
  size_t sVar2;
  size_t sVar3;
  _Alloc_hider _Var4;
  
  pBVar1 = getBroker(broker,err);
  if (pBVar1 != (Broker *)0x0) {
    if (valueName != (char *)0x0) {
      sVar2 = strlen(valueName);
      sVar3 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      _Var4 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
      if (value != (char *)0x0) {
        sVar3 = strlen(value);
        _Var4._M_p = value;
      }
      (*pBVar1->_vptr_Broker[0x12])(pBVar1,sVar2,valueName,sVar3,_Var4._M_p);
      return;
    }
    if (err != (HelicsError *)0x0) {
      err->error_code = -4;
      err->message = "Global name cannot be null";
    }
  }
  return;
}

Assistant:

void helicsBrokerSetGlobal(HelicsBroker broker, const char* valueName, const char* value, HelicsError* err)
{
    auto* brk = getBroker(broker, err);
    if (brk == nullptr) {
        return;
    }
    if (valueName == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidGlobalString);
        return;
    }
    brk->setGlobal(valueName, AS_STRING_VIEW(value));
}